

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

GLchar * gl4cts::ConditionalRenderInverted::Utilities::queryTargetToChars(GLenum mode)

{
  GLchar *pGStack_10;
  GLenum mode_local;
  
  if (mode == 0x8c2f) {
    pGStack_10 = queryTargetToChars::any_samples_name;
  }
  else if (mode == 0x8914) {
    pGStack_10 = queryTargetToChars::samples_name;
  }
  else {
    pGStack_10 = queryTargetToChars::invalid_target_name;
  }
  return pGStack_10;
}

Assistant:

const glw::GLchar* gl4cts::ConditionalRenderInverted::Utilities::queryTargetToChars(glw::GLenum mode)
{
	/* Const name values. */
	static const glw::GLchar* any_samples_name	= "GL_ANY_SAMPLES_PASSED";
	static const glw::GLchar* samples_name		  = "GL_SAMPLES_PASSED";
	static const glw::GLchar* invalid_target_name = "unknow mode";

	/* Return proper value. */
	if (GL_ANY_SAMPLES_PASSED == mode)
	{
		return any_samples_name;
	}

	if (GL_SAMPLES_PASSED == mode)
	{
		return samples_name;
	}

	/* If not, return invalid name. */
	return invalid_target_name;
}